

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O3

void __thiscall cppurses::detail::Event_queue::clean(Event_queue *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar1 == 0) {
    remove_nulls(&this->general_events_);
    remove_nulls(&this->paint_events_);
    remove_nulls(&this->delete_events_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

auto clean() -> void
    {
        Guard_t g{mtx_};
        remove_nulls(general_events_);
        remove_nulls(paint_events_);
        remove_nulls(delete_events_);
    }